

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O1

void __thiscall ObjectTest_set_bool_Test::TestBody(ObjectTest_set_bool_Test *this)

{
  byte bVar1;
  pointer *__ptr;
  char *pcVar2;
  pointer *__ptr_1;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  object obj;
  int local_98;
  undefined4 uStack_94;
  AssertHelper local_90 [8];
  int local_88;
  undefined4 uStack_84;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  undefined1 local_78 [8];
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_70;
  long local_68 [2];
  _Variadic_union<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  local_58;
  char local_28;
  
  local_58._M_first._M_storage = (_Uninitialized<void_*,_true>)(void *)0x0;
  local_28 = '\0';
  local_78[0] = (internal)0x1;
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::emplace<1ul,bool&>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_58._M_first,(bool *)local_78);
  local_88 = CONCAT31(local_88._1_3_,local_28 == '\x01');
  local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_28 != '\x01') {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_78,(char *)&local_88,"obj.has<bool>()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x353,(char *)CONCAT71(local_78._1_7_,local_78[0]));
    testing::internal::AssertHelper::operator=(local_90,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(local_90);
    if ((long *)CONCAT71(local_78._1_7_,local_78[0]) != local_68) {
      operator_delete((long *)CONCAT71(local_78._1_7_,local_78[0]),local_68[0] + 1);
    }
    if ((long *)CONCAT44(uStack_94,local_98) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(uStack_94,local_98) + 8))();
    }
  }
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,local_80);
  }
  bVar1 = local_28 == '\x01' & (byte)local_58._M_rest._0_1_;
  local_88 = CONCAT31(local_88._1_3_,bVar1);
  local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1 == 0) {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_78,(char *)&local_88,"obj.get<bool>()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x354,(char *)CONCAT71(local_78._1_7_,local_78[0]));
    testing::internal::AssertHelper::operator=(local_90,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(local_90);
    if ((long *)CONCAT71(local_78._1_7_,local_78[0]) != local_68) {
      operator_delete((long *)CONCAT71(local_78._1_7_,local_78[0]),local_68[0] + 1);
    }
    if ((long *)CONCAT44(uStack_94,local_98) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(uStack_94,local_98) + 8))();
    }
  }
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,local_80);
  }
  local_88 = CONCAT31(local_88._1_3_,local_28 != '\x02');
  local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_28 == '\x02') {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_78,(char *)&local_88,"obj.has<int>()","true");
    testing::internal::AssertHelper::AssertHelper
              (local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x355,(char *)CONCAT71(local_78._1_7_,local_78[0]));
    testing::internal::AssertHelper::operator=(local_90,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(local_90);
    if ((long *)CONCAT71(local_78._1_7_,local_78[0]) != local_68) {
      operator_delete((long *)CONCAT71(local_78._1_7_,local_78[0]),local_68[0] + 1);
    }
    if ((long *)CONCAT44(uStack_94,local_98) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(uStack_94,local_98) + 8))();
    }
  }
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,local_80);
  }
  local_88 = 0;
  if (local_28 == '\x02') {
    local_88 = local_58._0_4_;
  }
  local_98 = 0;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_78,"obj.get<int>()","0",&local_88,&local_98);
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_88);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_70._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_70._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x356,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    if ((long *)CONCAT44(uStack_84,local_88) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(uStack_84,local_88) + 8))();
    }
  }
  if (local_70._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70._M_head_impl);
  }
  local_78[0] = (internal)0x0;
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::emplace<1ul,bool&>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_58._M_first,(bool *)local_78);
  local_88 = CONCAT31(local_88._1_3_,local_28 == '\x01');
  local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_28 != '\x01') {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_78,(char *)&local_88,"obj.has<bool>()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x35a,(char *)CONCAT71(local_78._1_7_,local_78[0]));
    testing::internal::AssertHelper::operator=(local_90,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(local_90);
    if ((long *)CONCAT71(local_78._1_7_,local_78[0]) != local_68) {
      operator_delete((long *)CONCAT71(local_78._1_7_,local_78[0]),local_68[0] + 1);
    }
    if ((long *)CONCAT44(uStack_94,local_98) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(uStack_94,local_98) + 8))();
    }
  }
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,local_80);
  }
  bVar1 = ~(byte)local_58._M_rest._0_1_ & 1 | local_28 != '\x01';
  local_88 = CONCAT31(local_88._1_3_,bVar1);
  local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1 == 0) {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_78,(char *)&local_88,"obj.get<bool>()","true");
    testing::internal::AssertHelper::AssertHelper
              (local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x35b,(char *)CONCAT71(local_78._1_7_,local_78[0]));
    testing::internal::AssertHelper::operator=(local_90,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(local_90);
    if ((long *)CONCAT71(local_78._1_7_,local_78[0]) != local_68) {
      operator_delete((long *)CONCAT71(local_78._1_7_,local_78[0]),local_68[0] + 1);
    }
    if ((long *)CONCAT44(uStack_94,local_98) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(uStack_94,local_98) + 8))();
    }
  }
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,local_80);
  }
  local_88 = CONCAT31(local_88._1_3_,local_28 != '\x02');
  local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_28 == '\x02') {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_78,(char *)&local_88,"obj.has<int>()","true");
    testing::internal::AssertHelper::AssertHelper
              (local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x35c,(char *)CONCAT71(local_78._1_7_,local_78[0]));
    testing::internal::AssertHelper::operator=(local_90,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(local_90);
    if ((long *)CONCAT71(local_78._1_7_,local_78[0]) != local_68) {
      operator_delete((long *)CONCAT71(local_78._1_7_,local_78[0]),local_68[0] + 1);
    }
    if ((long *)CONCAT44(uStack_94,local_98) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(uStack_94,local_98) + 8))();
    }
  }
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,local_80);
  }
  local_88 = 0;
  if (local_28 == '\x02') {
    local_88 = local_58._0_4_;
  }
  local_98 = 0;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_78,"obj.get<int>()","0",&local_88,&local_98);
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_88);
    if (local_70._M_head_impl ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_70._M_head_impl)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x35d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    if ((long *)CONCAT44(uStack_84,local_88) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(uStack_84,local_88) + 8))();
    }
  }
  if ((_Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       )local_70._M_head_impl !=
      (_Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       )0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70._M_head_impl);
  }
  std::__detail::__variant::
  _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  ::~_Variant_storage((_Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                       *)&local_58._M_first);
  return;
}

Assistant:

TEST(ObjectTest, set_bool) {
	object obj;

	obj.set(true);

	EXPECT_TRUE(obj.has<bool>());
	EXPECT_TRUE(obj.get<bool>());
	EXPECT_FALSE(obj.has<int>());
	EXPECT_EQ(obj.get<int>(), 0);

	obj.set(false);

	EXPECT_TRUE(obj.has<bool>());
	EXPECT_FALSE(obj.get<bool>());
	EXPECT_FALSE(obj.has<int>());
	EXPECT_EQ(obj.get<int>(), 0);
}